

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O3

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  sexp psVar6;
  sexp_conflict psVar7;
  sexp_conflict op;
  sexp_conflict tmp;
  long local_70;
  sexp_conflict name;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  name = (sexp_conflict)0x43e;
  tmp = (sexp_conflict)0x43e;
  op = (sexp_conflict)0x43e;
  iVar2 = strcmp(version,"0.11.0");
  psVar7 = (sexp_conflict)0xb3e;
  if (iVar2 == 0) {
    iVar2 = strncmp(abi,"cv-gm*uh",8);
    if (iVar2 == 0) {
      local_60.var = &name;
      local_40.next = &local_60;
      local_60.next = (ctx->value).context.saves;
      local_40.var = &tmp;
      local_50.next = &local_40;
      local_50.var = &op;
      (ctx->value).context.saves = &local_50;
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-opt/sndlowat",0x13);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0x13,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-opt/rcvlowat",0x13);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0x12,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-opt/dontroute",0x14);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,5,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-opt/rcvbuf",0x11);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,8,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-opt/sndbuf",0x11);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,7,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-opt/oobinline",0x14);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,10,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-opt/keepalive",0x14);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,9,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-opt/reuseaddr",0x14);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,2,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-opt/broadcast",0x14);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,6,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-opt/debug",0x10);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"level/socket",0xc);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"ai/numeric-host",0xf);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,4,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"ai/canonname",0xc);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,2,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"ai/passive",10);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"ip-proto/udp",0xc);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0x11,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"ip-proto/tcp",0xc);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,6,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"ip-proto/icmp",0xd);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"ip-proto/ip",0xb);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-type/raw",0xf);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,3,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-type/datagram",0x14);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,2,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"socket-type/stream",0x12);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"address-family/inet6",0x14);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,10,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"address-family/inet",0x13);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,2,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"address-family/unix",0x13);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      psVar7 = (sexp_conflict)sexp_intern(ctx,"address-family/unspecified",0x1a);
      name = psVar7;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0,0);
      sexp_env_define(ctx,env,psVar7,tmp);
      name = (sexp_conflict)sexp_c_string(ctx,"addrinfo",0xffffffffffffffff);
      lVar3 = sexp_register_type_op
                        (ctx,0,0x12,name,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                         "sexp_freeaddrinfo_stub",sexp_freeaddrinfo_stub);
      tmp = (sexp_conflict)sexp_string_to_symbol_op(ctx,0,1,name);
      sexp_env_define(ctx,env,tmp,lVar3);
      lVar5 = lVar3 + 0x18;
      *(undefined8 *)(lVar3 + 0x18) = 0x23e;
      uVar4 = sexp_intern(ctx,"ai_next",0xffffffffffffffff);
      sexp_push_op(ctx,lVar5,uVar4);
      uVar4 = sexp_intern(ctx,"ai_canonname",0xffffffffffffffff);
      sexp_push_op(ctx,lVar5,uVar4);
      uVar4 = sexp_intern(ctx,"ai_addrlen",0xffffffffffffffff);
      sexp_push_op(ctx,lVar5,uVar4);
      uVar4 = sexp_intern(ctx,"ai_addr",0xffffffffffffffff);
      sexp_push_op(ctx,lVar5,uVar4);
      uVar4 = sexp_intern(ctx,"ai_flags",0xffffffffffffffff);
      sexp_push_op(ctx,lVar5,uVar4);
      uVar4 = sexp_intern(ctx,"ai_protocol",0xffffffffffffffff);
      sexp_push_op(ctx,lVar5,uVar4);
      uVar4 = sexp_intern(ctx,"ai_socktype",0xffffffffffffffff);
      sexp_push_op(ctx,lVar5,uVar4);
      uVar4 = sexp_intern(ctx,"ai_family",0xffffffffffffffff);
      sexp_push_op(ctx,lVar5,uVar4);
      uVar4 = sexp_make_vector_op(ctx,0,2,0x11,0x3e);
      *(undefined8 *)(lVar3 + 0x20) = uVar4;
      uVar4 = sexp_make_vector_op(ctx,0,2,0x11,0x3e);
      *(undefined8 *)(lVar3 + 0x28) = uVar4;
      local_70 = lVar3;
      tmp = (sexp_conflict)sexp_make_type_predicate_op(ctx,0,2,name,lVar3);
      name = (sexp_conflict)sexp_intern(ctx,"address-info?",0xd);
      sexp_env_define(ctx,env,name,tmp);
      name = (sexp_conflict)sexp_c_string(ctx,"sockaddr",0xffffffffffffffff);
      lVar5 = sexp_register_type_op
                        (ctx,0,0x12,name,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                         "sexp_finalize_c_type",sexp_finalize_c_type);
      tmp = (sexp_conflict)sexp_string_to_symbol_op(ctx,0,1,name);
      sexp_env_define(ctx,env,tmp,lVar5);
      tmp = (sexp_conflict)sexp_make_type_predicate_op(ctx,0,2,name,lVar5);
      name = (sexp_conflict)sexp_intern(ctx,"sockaddr?",9);
      sexp_env_define(ctx,env,name,tmp);
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"make-sockaddr",0,0,"sexp_make_sockaddr_stub",sexp_make_sockaddr_stub,
                      0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).type.setters = (sexp)((ulong)*(uint *)(lVar5 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"address-info-next",1,0,"sexp_addrinfo_get_ai_next",
                      sexp_addrinfo_get_ai_next,0);
      lVar3 = local_70;
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).type.setters = (sexp)((ulong)*(uint *)(local_70 + 0x50) * 2 + 1);
        (op->value).type.id = (sexp)((ulong)*(uint *)(local_70 + 0x50) * 2 + 1);
      }
      piVar1 = *(int **)(local_70 + 0x20);
      if ((((ulong)piVar1 & 3) == 0) && (*piVar1 == 10)) {
        *(sexp_conflict *)(piVar1 + 0x12) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"address-info-canonname",1,0,"sexp_addrinfo_get_ai_canonname",
                      sexp_addrinfo_get_ai_canonname,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x13;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar1 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar1 & 3) == 0) && (*piVar1 == 10)) {
        *(sexp_conflict *)(piVar1 + 0x10) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"address-info-address-length",1,0,"sexp_addrinfo_get_ai_addrlen",
                      sexp_addrinfo_get_ai_addrlen,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar1 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar1 & 3) == 0) && (*piVar1 == 10)) {
        *(sexp_conflict *)(piVar1 + 0xe) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"address-info-address",1,0,"sexp_addrinfo_get_ai_addr",
                      sexp_addrinfo_get_ai_addr,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).type.setters = (sexp)((ulong)*(uint *)(lVar5 + 0x50) * 2 + 1);
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar1 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar1 & 3) == 0) && (*piVar1 == 10)) {
        *(sexp_conflict *)(piVar1 + 0xc) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"address-info-flags",1,0,"sexp_addrinfo_get_ai_flags",
                      sexp_addrinfo_get_ai_flags,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar1 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar1 & 3) == 0) && (*piVar1 == 10)) {
        *(sexp_conflict *)(piVar1 + 10) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"address-info-protocol",1,0,"sexp_addrinfo_get_ai_protocol",
                      sexp_addrinfo_get_ai_protocol,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar1 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar1 & 3) == 0) && (*piVar1 == 10)) {
        *(sexp_conflict *)(piVar1 + 8) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"address-info-socket-type",1,0,"sexp_addrinfo_get_ai_socktype",
                      sexp_addrinfo_get_ai_socktype,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar1 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar1 & 3) == 0) && (*piVar1 == 10)) {
        *(sexp_conflict *)(piVar1 + 6) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"address-info-family",1,0,"sexp_addrinfo_get_ai_family",
                      sexp_addrinfo_get_ai_family,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar1 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar1 & 3) == 0) && (*piVar1 == 10)) {
        *(sexp_conflict *)(piVar1 + 4) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"%make-address-info",4,0,"sexp_25_make_address_info_stub",
                      sexp_25_make_address_info_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).type.setters = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
        (op->value).type.id = (sexp)0x5;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
        psVar6 = (sexp)sexp_make_vector_op(ctx,0,2,3,1);
        (op->value).type.finalize_name = psVar6;
        (psVar6->value).string.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"freeaddrinfo",1,0,"sexp_freeaddrinfo_stub",sexp_freeaddrinfo_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"set-socket-option!",4,0,"sexp_set_socket_option_x_stub",
                      sexp_set_socket_option_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x25;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
        psVar6 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar6;
        (psVar6->value).string.offset = 5;
        (((op->value).type.finalize_name)->value).uvector.length = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"getsockopt",3,0,"sexp_getsockopt_stub",sexp_getsockopt_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x25;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
        psVar6 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar6;
        (psVar6->value).string.offset = 5;
        (((op->value).type.finalize_name)->value).uvector.length = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"get-peer-name",2,0,"sexp_get_peer_name_stub",sexp_get_peer_name_stub,
                      0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x25;
        (op->value).type.print = (sexp)((ulong)*(uint *)(lVar5 + 0x50) * 2 + 1);
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"sockaddr-port",1,0,"sexp_sockaddr_port_stub",sexp_sockaddr_port_stub,
                      0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.dl = (sexp)((ulong)*(uint *)(lVar5 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"sockaddr-name",1,0,"sexp_sockaddr_name_stub",sexp_sockaddr_name_stub,
                      0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.dl = (sexp)((ulong)*(uint *)(lVar5 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"open-socket-pair",3,0,"sexp_open_socket_pair_stub",
                      sexp_open_socket_pair_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x5;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
        psVar6 = (sexp)sexp_make_vector_op(ctx,0,2,3,1);
        (op->value).type.finalize_name = psVar6;
        (psVar6->value).string.offset = 0x25;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"%receive!",6,0,"sexp_25_receive_x_stub",sexp_25_receive_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).port.line = 0x25;
        psVar6 = (sexp)sexp_make_vector_op(ctx,0,2,0xd,1);
        (op->value).type.finalize_name = psVar6;
        (psVar6->value).string.offset = 0x11;
        (((op->value).type.finalize_name)->value).uvector.length = 5;
        (((op->value).type.finalize_name)->value).bytecode.length = 5;
        (((op->value).type.finalize_name)->value).type.setters =
             (sexp)((ulong)*(uint *)(lVar5 + 0x50) * 2 + 1);
        (((op->value).type.finalize_name)->value).type.id = (sexp)0x5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"%send",6,0,"sexp_25_send_stub",sexp_25_send_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).port.line = 0x25;
        psVar6 = (sexp)sexp_make_vector_op(ctx,0,2,0xd,1);
        (op->value).type.finalize_name = psVar6;
        (psVar6->value).string.offset = 0x11;
        (((op->value).type.finalize_name)->value).uvector.length = 5;
        (((op->value).type.finalize_name)->value).bytecode.length = 5;
        (((op->value).type.finalize_name)->value).type.setters =
             (sexp)((ulong)*(uint *)(lVar5 + 0x50) * 2 + 1);
        (((op->value).type.finalize_name)->value).type.id = (sexp)0x5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"connect",3,0,"sexp_connect_stub",sexp_connect_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x25;
        (op->value).type.print = (sexp)((ulong)*(uint *)(lVar5 + 0x50) * 2 + 1);
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"socket",3,0,"sexp_socket_stub",sexp_socket_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x25;
        (op->value).type.id = (sexp)0x5;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"accept",3,0,"sexp_accept_stub",sexp_accept_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).port.line = 0x25;
        psVar6 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar6;
        (psVar6->value).type.cpl = (sexp)((ulong)*(uint *)(lVar5 + 0x50) * 2 + 1);
        (((op->value).type.finalize_name)->value).uvector.length = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"listen",2,0,"sexp_listen_stub",sexp_listen_stub,0);
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"bind",3,0,"sexp_bind_stub",sexp_bind_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).port.line = 0x25;
        psVar6 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar6;
        (psVar6->value).type.cpl = (sexp)((ulong)*(uint *)(lVar5 + 0x50) * 2 + 1);
        (((op->value).type.finalize_name)->value).uvector.length = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"%get-address-info",3,0,"sexp_25_get_address_info_stub",
                      sexp_25_get_address_info_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x13;
        (op->value).port.offset = 0x13;
        (op->value).type.dl = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
        psVar6 = (sexp)sexp_make_vector_op(ctx,0,2,3,1);
        (op->value).type.finalize_name = psVar6;
        (psVar6->value).type.cpl = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      (ctx->value).context.saves = local_60.next;
      psVar7 = (sexp_conflict)0x43e;
    }
  }
  return psVar7;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp sexp_addrinfo_type_obj;
  sexp sexp_sockaddr_type_obj;
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  name = sexp_intern(ctx, "socket-opt/sndlowat", 19);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_SNDLOWAT));
  name = sexp_intern(ctx, "socket-opt/rcvlowat", 19);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_RCVLOWAT));
  name = sexp_intern(ctx, "socket-opt/dontroute", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_DONTROUTE));
  name = sexp_intern(ctx, "socket-opt/rcvbuf", 17);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_RCVBUF));
  name = sexp_intern(ctx, "socket-opt/sndbuf", 17);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_SNDBUF));
  name = sexp_intern(ctx, "socket-opt/oobinline", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_OOBINLINE));
  name = sexp_intern(ctx, "socket-opt/keepalive", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_KEEPALIVE));
  name = sexp_intern(ctx, "socket-opt/reuseaddr", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_REUSEADDR));
  name = sexp_intern(ctx, "socket-opt/broadcast", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_BROADCAST));
  name = sexp_intern(ctx, "socket-opt/debug", 16);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_DEBUG));
  name = sexp_intern(ctx, "level/socket", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SOL_SOCKET));
  name = sexp_intern(ctx, "ai/numeric-host", 15);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AI_NUMERICHOST));
  name = sexp_intern(ctx, "ai/canonname", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AI_CANONNAME));
  name = sexp_intern(ctx, "ai/passive", 10);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AI_PASSIVE));
  name = sexp_intern(ctx, "ip-proto/udp", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, IPPROTO_UDP));
  name = sexp_intern(ctx, "ip-proto/tcp", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, IPPROTO_TCP));
  name = sexp_intern(ctx, "ip-proto/icmp", 13);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, IPPROTO_ICMP));
  name = sexp_intern(ctx, "ip-proto/ip", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, IPPROTO_IP));
  name = sexp_intern(ctx, "socket-type/raw", 15);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SOCK_RAW));
  name = sexp_intern(ctx, "socket-type/datagram", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SOCK_DGRAM));
  name = sexp_intern(ctx, "socket-type/stream", 18);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SOCK_STREAM));
  name = sexp_intern(ctx, "address-family/inet6", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AF_INET6));
  name = sexp_intern(ctx, "address-family/inet", 19);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AF_INET));
  name = sexp_intern(ctx, "address-family/unix", 19);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AF_UNIX));
  name = sexp_intern(ctx, "address-family/unspecified", 26);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AF_UNSPEC));
  name = sexp_c_string(ctx, "addrinfo", -1);
  sexp_addrinfo_type_obj = sexp_register_c_type(ctx, name, sexp_freeaddrinfo_stub);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_addrinfo_type_obj);
  sexp_type_slots(sexp_addrinfo_type_obj) = SEXP_NULL;
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_next", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_canonname", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_addrlen", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_addr", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_flags", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_protocol", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_socktype", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_family", -1));
  sexp_type_getters(sexp_addrinfo_type_obj) = sexp_make_vector(ctx, SEXP_EIGHT, SEXP_FALSE);
  sexp_type_setters(sexp_addrinfo_type_obj) = sexp_make_vector(ctx, SEXP_EIGHT, SEXP_FALSE);
  tmp = sexp_make_type_predicate(ctx, name, sexp_addrinfo_type_obj);
  name = sexp_intern(ctx, "address-info?", 13);
  sexp_env_define(ctx, env, name, tmp);
  name = sexp_c_string(ctx, "sockaddr", -1);
  sexp_sockaddr_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_sockaddr_type_obj);
  tmp = sexp_make_type_predicate(ctx, name, sexp_sockaddr_type_obj);
  name = sexp_intern(ctx, "sockaddr?", 9);
  sexp_env_define(ctx, env, name, tmp);
  op = sexp_define_foreign(ctx, env, "make-sockaddr", 0, sexp_make_sockaddr_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "address-info-next", 1, sexp_addrinfo_get_ai_next);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_SEVEN, op);
  op = sexp_define_foreign(ctx, env, "address-info-canonname", 1, sexp_addrinfo_get_ai_canonname);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_SIX, op);
  op = sexp_define_foreign(ctx, env, "address-info-address-length", 1, sexp_addrinfo_get_ai_addrlen);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_FIVE, op);
  op = sexp_define_foreign(ctx, env, "address-info-address", 1, sexp_addrinfo_get_ai_addr);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj));
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_FOUR, op);
  op = sexp_define_foreign(ctx, env, "address-info-flags", 1, sexp_addrinfo_get_ai_flags);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_THREE, op);
  op = sexp_define_foreign(ctx, env, "address-info-protocol", 1, sexp_addrinfo_get_ai_protocol);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_TWO, op);
  op = sexp_define_foreign(ctx, env, "address-info-socket-type", 1, sexp_addrinfo_get_ai_socktype);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_ONE, op);
  op = sexp_define_foreign(ctx, env, "address-info-family", 1, sexp_addrinfo_get_ai_family);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_ZERO, op);
  op = sexp_define_foreign(ctx, env, "%make-address-info", 4, sexp_25_make_address_info_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_ONE, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "freeaddrinfo", 1, sexp_freeaddrinfo_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "set-socket-option!", 4, sexp_set_socket_option_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "getsockopt", 3, sexp_getsockopt_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "get-peer-name", 2, sexp_get_peer_name_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "sockaddr-port", 1, sexp_sockaddr_port_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "sockaddr-name", 1, sexp_sockaddr_name_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "open-socket-pair", 3, sexp_open_socket_pair_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_ONE, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FILENO));
  }
  op = sexp_define_foreign(ctx, env, "%receive!", 6, sexp_25_receive_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_SIX, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_BYTES));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_TWO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_THREE, sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj)));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_FOUR, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "%send", 6, sexp_25_send_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_SIX, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_BYTES));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_TWO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_THREE, sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj)));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_FOUR, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "connect", 3, sexp_connect_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "socket", 3, sexp_socket_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "accept", 3, sexp_accept_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj)));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "listen", 2, sexp_listen_stub);
  op = sexp_define_foreign(ctx, env, "bind", 3, sexp_bind_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj)));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "%get-address-info", 3, sexp_25_get_address_info_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_ONE, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj)));
  }
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}